

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatus.cxx
# Opt level: O0

int testStatus(int param_1,char **param_2)

{
  bool bVar1;
  byte bVar2;
  Kind KVar3;
  int iVar4;
  int *piVar5;
  string local_88;
  Status local_64;
  string local_50;
  Status local_2c;
  Status local_24;
  Status status;
  bool res;
  char **param_1_local;
  int param_0_local;
  
  status.Kind_._3_1_ = 1;
  unique0x100003db = param_2;
  cmsys::Status::Status(&local_24);
  KVar3 = cmsys::Status::GetKind(&local_24);
  if (KVar3 != Success) {
    std::operator<<((ostream *)&std::cerr,"Status default constructor does not produce Success\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  local_2c = cmsys::Status::Success();
  local_24 = local_2c;
  KVar3 = cmsys::Status::GetKind(&local_24);
  if (KVar3 != Success) {
    std::operator<<((ostream *)&std::cerr,"Status Success constructor does not produce Success\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  bVar1 = cmsys::Status::IsSuccess(&local_24);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cerr,"Status Success gives false IsSuccess\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_24);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cerr,"Status Success kind is not true\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  iVar4 = cmsys::Status::GetPOSIX(&local_24);
  if (iVar4 != 0) {
    std::operator<<((ostream *)&std::cerr,"Status Success kind does not return POSIX 0\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  cmsys::Status::GetString_abi_cxx11_(&local_50,&local_24);
  bVar1 = std::operator!=(&local_50,"Success");
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"Status Success kind does not return \"Success\" string\n"
                   );
    status.Kind_._3_1_ = Success >> 0x18;
  }
  local_64 = cmsys::Status::POSIX(0x16);
  local_24 = local_64;
  KVar3 = cmsys::Status::GetKind(&local_24);
  if (KVar3 != POSIX) {
    std::operator<<((ostream *)&std::cerr,"Status POSIX constructor does not produce POSIX\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  bVar1 = cmsys::Status::IsSuccess(&local_24);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"Status POSIX gives true IsSuccess\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_24);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"Status POSIX kind is not false\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  iVar4 = cmsys::Status::GetPOSIX(&local_24);
  if (iVar4 != 0x16) {
    std::operator<<((ostream *)&std::cerr,"Status POSIX kind does not preserve POSIX value\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  cmsys::Status::GetString_abi_cxx11_(&local_88,&local_24);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_88);
  if ((bVar2 & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"Status POSIX kind returns empty string\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  piVar5 = __errno_location();
  *piVar5 = 2;
  local_24 = cmsys::Status::POSIX_errno();
  iVar4 = cmsys::Status::GetPOSIX(&local_24);
  if (iVar4 != 2) {
    std::operator<<((ostream *)&std::cerr,"Status POSIX_errno did not use errno\n");
    status.Kind_._3_1_ = Success >> 0x18;
  }
  piVar5 = __errno_location();
  *piVar5 = 0;
  return (uint)((status.Kind_._3_1_ & 1) == Success >> 0x18);
}

Assistant:

int testStatus(int, char* [])
{
  bool res = true;
  {
    kwsys::Status status;
    if (status.GetKind() != kwsys::Status::Kind::Success) {
      std::cerr << "Status default constructor does not produce Success\n";
      res = false;
    }

    status = kwsys::Status::Success();
    if (status.GetKind() != kwsys::Status::Kind::Success) {
      std::cerr << "Status Success constructor does not produce Success\n";
      res = false;
    }
    if (!status.IsSuccess()) {
      std::cerr << "Status Success gives false IsSuccess\n";
      res = false;
    }
    if (!status) {
      std::cerr << "Status Success kind is not true\n";
      res = false;
    }
    if (status.GetPOSIX() != 0) {
      std::cerr << "Status Success kind does not return POSIX 0\n";
      res = false;
    }
#ifdef _WIN32
    if (status.GetWindows() != 0) {
      std::cerr << "Status Success kind does not return Windows 0\n";
      res = false;
    }
#endif
    if (status.GetString() != "Success") {
      std::cerr << "Status Success kind does not return \"Success\" string\n";
      res = false;
    }

    status = kwsys::Status::POSIX(EINVAL);
    if (status.GetKind() != kwsys::Status::Kind::POSIX) {
      std::cerr << "Status POSIX constructor does not produce POSIX\n";
      res = false;
    }
    if (status.IsSuccess()) {
      std::cerr << "Status POSIX gives true IsSuccess\n";
      res = false;
    }
    if (status) {
      std::cerr << "Status POSIX kind is not false\n";
      res = false;
    }
    if (status.GetPOSIX() != EINVAL) {
      std::cerr << "Status POSIX kind does not preserve POSIX value\n";
      res = false;
    }
#ifdef _WIN32
    if (status.GetWindows() != 0) {
      std::cerr << "Status POSIX kind does not return Windows 0\n";
      res = false;
    }
#endif
    if (status.GetString().empty()) {
      std::cerr << "Status POSIX kind returns empty string\n";
      res = false;
    }
    errno = ENOENT;
    status = kwsys::Status::POSIX_errno();
    if (status.GetPOSIX() != ENOENT) {
      std::cerr << "Status POSIX_errno did not use errno\n";
      res = false;
    }
    errno = 0;

#ifdef _WIN32
    status = kwsys::Status::Windows(ERROR_INVALID_PARAMETER);
    if (status.GetKind() != kwsys::Status::Kind::Windows) {
      std::cerr << "Status Windows constructor does not produce Windows\n";
      res = false;
    }
    if (status.IsSuccess()) {
      std::cerr << "Status Windows gives true IsSuccess\n";
      res = false;
    }
    if (status) {
      std::cerr << "Status Windows kind is not false\n";
      res = false;
    }
    if (status.GetWindows() != ERROR_INVALID_PARAMETER) {
      std::cerr << "Status Windows kind does not preserve Windows value\n";
      res = false;
    }
    if (status.GetPOSIX() != 0) {
      std::cerr << "Status Windows kind does not return POSIX 0\n";
      res = false;
    }
    if (status.GetString().empty()) {
      std::cerr << "Status Windows kind returns empty string\n";
      res = false;
    }

    SetLastError(ERROR_FILE_NOT_FOUND);
    status = kwsys::Status::Windows_GetLastError();
    if (status.GetWindows() != ERROR_FILE_NOT_FOUND) {
      std::cerr << "Status Windows_GetLastError did not use GetLastError()\n";
      res = false;
    }
    SetLastError(ERROR_SUCCESS);
#endif
  }
  return res ? 0 : 1;
}